

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageAnalyzer.cpp
# Opt level: O3

void __thiscall pageAnalyzer::decomposePageContent(pageAnalyzer *this)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  char cVar5;
  int iVar6;
  string tmp;
  value_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  sVar2 = (this->inputPage)._M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (this->inputPage)._M_dataplus._M_p;
    iVar6 = 0x17;
    sVar4 = 0;
    do {
      cVar1 = pcVar3[sVar4];
      cVar5 = (char)&local_50;
      if (iVar6 == 0x17) {
        if (cVar1 == '<') {
          iVar6 = 0x18;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->pageContent,&local_50);
LAB_0010a4fa:
          local_50._M_string_length = 0;
          *local_50._M_dataplus._M_p = '\0';
        }
        else {
          iVar6 = 0x17;
          std::__cxx11::string::push_back(cVar5);
        }
      }
      else {
        if (cVar1 == '>') {
          iVar6 = 0x17;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->pageContent,&local_50);
          goto LAB_0010a4fa;
        }
        iVar6 = 0x18;
        std::__cxx11::string::push_back(cVar5);
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void pageAnalyzer::decomposePageContent()
{
    std::string tmp = std::string("");
    int state = OUTSIDE_ANGLEBRACKET;
    for (char i : this->inputPage)
    {
        if(state == OUTSIDE_ANGLEBRACKET)
        {
            if(i != '<')
                tmp += i;
            else
            {
                state = INSIDE_ANGLEBRACKET;
                this->pageContent.push_back(tmp);
                tmp.clear();
            }
        }
        else if(state == INSIDE_ANGLEBRACKET)
        {
            if(i != '>')
                tmp += i;
            else
            {
                state = OUTSIDE_ANGLEBRACKET;
                this->pageContent.push_back(tmp);
                tmp.clear();
            }
        }
        else;
    }
}